

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O2

int fy_atom_format_text_length(fy_atom *atom)

{
  fy_iter_chunk *curr;
  int iVar1;
  size_t sVar2;
  int ret;
  fy_atom_iter iter;
  
  iVar1 = -1;
  if (atom != (fy_atom *)0x0) {
    if ((atom->field_0x35 & 8) == 0) {
      fy_atom_iter_start(atom,&iter);
      curr = (fy_iter_chunk *)0x0;
      sVar2 = 0;
      while( true ) {
        curr = fy_atom_iter_chunk_next(&iter,curr,&ret);
        if (curr == (fy_iter_chunk *)0x0) break;
        sVar2 = sVar2 + curr->len;
      }
      fy_atom_iter_finish(&iter);
      if ((-1 < (int)sVar2) && (iVar1 = ret, ret == 0)) {
        atom->storage_hint = sVar2;
        atom->field_0x35 = atom->field_0x35 | 8;
        iVar1 = (int)sVar2;
      }
    }
    else {
      iVar1 = (int)atom->storage_hint;
    }
  }
  return iVar1;
}

Assistant:

int fy_atom_format_text_length(struct fy_atom *atom) {
    struct fy_atom_iter iter;
    const struct fy_iter_chunk *ic;
    size_t len;
    int ret;

    if (!atom)
        return -1;

    if (atom->storage_hint_valid)
        return atom->storage_hint;

    len = 0;
    fy_atom_iter_start(atom, &iter);
    ic = NULL;
    while ((ic = fy_atom_iter_chunk_next(&iter, ic, &ret)) != NULL)
        len += ic->len;
    fy_atom_iter_finish(&iter);

    /* something funky going on here */
    if ((int) len < 0)
        return -1;

    if (ret != 0)
        return ret;

    atom->storage_hint = (size_t) len;
    atom->storage_hint_valid = true;
    return (int) len;
}